

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codedump.c
# Opt level: O0

uintptr_t find_init_task_from_systemmap(char *map)

{
  char *pcVar1;
  char *in_RDI;
  char *p;
  uintptr_t addr;
  char buf [4096];
  FILE *fp;
  ulong local_1020;
  char local_1018 [4096];
  FILE *local_18;
  ulong local_8;
  
  local_1020 = 0;
  local_18 = fopen(in_RDI,"r");
  if (local_18 == (FILE *)0x0) {
    perror("fopen");
    local_8 = 0;
  }
  else {
    while (pcVar1 = fgets(local_1018,0x1000,local_18), pcVar1 != (char *)0x0) {
      pcVar1 = strstr(local_1018,"D init_task");
      if (pcVar1 != (char *)0x0) {
        pcVar1 = strchr(local_1018,0x20);
        *pcVar1 = '\0';
        local_1020 = strtoul(local_1018,(char **)0x0,0x10);
      }
    }
    fclose(local_18);
    local_8 = local_1020;
  }
  return local_8;
}

Assistant:

uintptr_t find_init_task_from_systemmap(char *map)
{
	FILE *fp;
	char buf[4096];
	uintptr_t addr = 0;

	fp = fopen(map, "r");
	if (!fp) {
		perror("fopen");
		return 0;
	}

	while(fgets(buf, sizeof(buf), fp) != NULL) {
		if (strstr(buf, "D init_task")) {
			char *p;
			p = strchr(buf, ' ');
			*p = '\0';
			addr = strtoul(buf, NULL, 16);
		}
	}

	fclose(fp);

	return addr;
}